

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int need_value(FuncState *fs,int list)

{
  uint *puVar1;
  uint *puVar2;
  
  if (list != -1) {
    do {
      puVar1 = fs->f->code + list;
      puVar2 = puVar1;
      if ((0 < list) && ((0x3df07fffffU >> ((ulong)puVar1[-1] & 0x3f) & 1) == 0)) {
        puVar2 = puVar1 + -1;
      }
      if ((*puVar2 & 0x3f) != 0x1b) {
        return 1;
      }
      list = list + -0x1fffe + (*puVar1 >> 0xe);
      if (*puVar1 >> 0xe == 0x1fffe) {
        list = -1;
      }
    } while (list != -1);
  }
  return 0;
}

Assistant:

static int need_value(FuncState*fs,int list){
for(;list!=(-1);list=getjump(fs,list)){
Instruction i=*getjumpcontrol(fs,list);
if(GET_OPCODE(i)!=OP_TESTSET)return 1;
}
return 0;
}